

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_pred_avx2.c
# Opt level: O1

void uavs3d_ipred_ang_xy_13_avx2(pel *src,pel *dst,int i_dst,int mode,int width,int height)

{
  long lVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  pel *ppVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  pel *ppVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar31 [16];
  undefined1 auVar26 [32];
  undefined1 auVar30 [32];
  
  auVar2 = _DAT_0017edf0;
  uVar3 = 7;
  if (height < 7) {
    uVar3 = height;
  }
  if (height < 1) {
    uVar9 = 0;
  }
  else {
    uVar9 = 0;
    uVar6 = 1;
    auVar16._16_16_ = _DAT_0017edf0;
    auVar16._0_16_ = _DAT_0017edf0;
    auVar28._8_2_ = 0x40;
    auVar28._0_8_ = 0x40004000400040;
    auVar28._10_2_ = 0x40;
    auVar28._12_2_ = 0x40;
    auVar28._14_2_ = 0x40;
    do {
      iVar8 = uVar9 * -0x403fffc;
      uVar9 = uVar9 + 1;
      iVar8 = uVar9 * 0x400 + iVar8 + 0x1c3c2004;
      auVar18._4_4_ = iVar8;
      auVar18._0_4_ = iVar8;
      auVar18._8_4_ = iVar8;
      auVar18._12_4_ = iVar8;
      auVar20._16_4_ = iVar8;
      auVar20._0_16_ = auVar18;
      auVar20._20_4_ = iVar8;
      auVar20._24_4_ = iVar8;
      auVar20._28_4_ = iVar8;
      if (width < 5) {
        lVar11 = -(ulong)(uVar9 >> 3);
        uVar15 = 0;
      }
      else {
        uVar14 = uVar6 >> 3;
        uVar13 = 0;
        do {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *(ulong *)(src + uVar13 + (3 - uVar14));
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(src + uVar13 + (-1 - uVar14));
          auVar23._0_16_ = ZEXT116(0) * auVar21 + ZEXT116(1) * auVar24;
          auVar23._16_16_ = ZEXT116(1) * auVar21;
          auVar23 = vpshufb_avx2(auVar23,auVar16);
          auVar23 = vpmaddubsw_avx2(auVar23,auVar20);
          auVar21 = vphaddw_avx(auVar23._0_16_,auVar23._16_16_);
          auVar21 = vpaddw_avx(auVar21,auVar28);
          auVar21 = vpsrlw_avx(auVar21,7);
          auVar21 = vpackuswb_avx(auVar21,auVar21);
          *(long *)(dst + uVar13) = auVar21._0_8_;
          uVar15 = uVar13 + 8;
          lVar11 = uVar13 + 0xc;
          uVar13 = uVar15;
        } while (lVar11 < width);
        lVar11 = uVar15 - uVar14;
      }
      if ((int)uVar15 < width) {
        auVar22._8_8_ = 0;
        auVar22._0_8_ = *(ulong *)(src + lVar11 + -1);
        auVar21 = vpshufb_avx(auVar22,auVar2);
        auVar18 = vpmaddubsw_avx(auVar21,auVar18);
        auVar18 = vphaddw_avx(auVar18,auVar18);
        auVar18 = vpaddw_avx(auVar18,auVar28);
        auVar18 = vpsrlw_avx(auVar18,7);
        auVar18 = vpackuswb_avx(auVar18,auVar18);
        *(int *)(dst + (uVar15 & 0xffffffff)) = auVar18._0_4_;
      }
      dst = dst + i_dst;
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar3);
  }
  auVar2 = _DAT_0017edf0;
  if (width == 4) {
    if ((int)uVar9 < height) {
      uVar15 = (ulong)uVar9;
      ppVar10 = src + (8 - uVar15);
      uVar6 = uVar15;
      do {
        uVar6 = uVar6 + 1;
        uVar15 = uVar15 + 1;
        iVar8 = (int)((double)(int)uVar15 * 0.125 + 0.9999);
        uVar3 = iVar8 - 1;
        uVar13 = 0;
        if (1 < iVar8) {
          uVar9 = 4;
          if ((int)uVar3 < 4) {
            uVar9 = uVar3;
          }
          uVar13 = 0;
          do {
            dst[uVar13] = (pel)((uint)ppVar10[uVar13 * 8 + -2] + (uint)ppVar10[uVar13 * 8 + -1] * 2
                                + (uint)ppVar10[uVar13 * 8] + 2 >> 2);
            uVar13 = uVar13 + 1;
          } while (uVar9 != uVar13);
        }
        if ((int)uVar13 < 4) {
          uVar9 = (int)uVar15 * 4 & 0x1c;
          lVar7 = (long)(int)uVar3 - (uVar6 >> 3 & 0x1fffffff);
          lVar11 = 0;
          do {
            dst[lVar11 + (uVar13 & 0xffffffff)] =
                 (pel)(src[lVar11 + lVar7 + -1] * uVar9 +
                       (uint)src[lVar11 + lVar7] * (uVar9 + 0x20) +
                       (uint)src[lVar11 + lVar7 + 1] * (0x40 - uVar9) +
                       (uint)src[lVar11 + lVar7 + 2] * (0x20 - uVar9) + 0x40 >> 7);
            lVar11 = lVar11 + 1;
          } while (4 - (uVar13 & 0xffffffff) != lVar11);
        }
        dst = dst + i_dst;
        ppVar10 = ppVar10 + -1;
      } while (uVar15 != (uint)height);
    }
  }
  else if ((int)uVar9 < height) {
    uVar15 = (ulong)uVar9;
    ppVar10 = src + (8 - uVar15);
    auVar17._16_16_ = _DAT_0017edf0;
    auVar17._0_16_ = _DAT_0017edf0;
    auVar19._8_2_ = 0x40;
    auVar19._0_8_ = 0x40004000400040;
    auVar19._10_2_ = 0x40;
    auVar19._12_2_ = 0x40;
    auVar19._14_2_ = 0x40;
    uVar6 = uVar15;
    do {
      uVar6 = uVar6 + 1;
      uVar15 = uVar15 + 1;
      iVar8 = (int)((double)(int)uVar15 * 0.125 + 0.9999);
      uVar3 = iVar8 - 1;
      uVar9 = width;
      if ((int)uVar3 < width) {
        uVar9 = uVar3;
      }
      if (0 < (int)uVar9) {
        uVar13 = 0;
        do {
          dst[uVar13] = (pel)((uint)ppVar10[uVar13 * 8] +
                              (uint)ppVar10[uVar13 * 8 + -2] + (uint)ppVar10[uVar13 * 8 + -1] * 2 +
                              2 >> 2);
          uVar13 = uVar13 + 1;
        } while (uVar9 != uVar13);
      }
      uVar12 = (int)uVar15 * 4 & 0x1c;
      uVar4 = (0x20 - uVar12) * 0x1000000 | (0x40 - uVar12) * 0x10000 | (uVar12 + 0x20) * 0x100 |
              uVar12;
      auVar25._4_4_ = uVar4;
      auVar25._0_4_ = uVar4;
      auVar25._8_4_ = uVar4;
      auVar25._12_4_ = uVar4;
      auVar26._16_4_ = uVar4;
      auVar26._0_16_ = auVar25;
      auVar26._20_4_ = uVar4;
      auVar26._24_4_ = uVar4;
      auVar26._28_4_ = uVar4;
      if ((int)(uVar9 + 7) < width) {
        if (width <= (int)uVar3) {
          uVar3 = width;
        }
        lVar7 = (long)iVar8 - (uVar6 >> 3 & 0x1fffffff);
        lVar11 = 0;
        do {
          auVar27._8_8_ = 0;
          auVar27._0_8_ = *(ulong *)(src + lVar11 + lVar7 + 2);
          auVar31._8_8_ = 0;
          auVar31._0_8_ = *(ulong *)(src + lVar11 + lVar7 + -2);
          auVar30._0_16_ = ZEXT116(0) * auVar27 + ZEXT116(1) * auVar31;
          auVar30._16_16_ = ZEXT116(1) * auVar27;
          auVar16 = vpshufb_avx2(auVar30,auVar17);
          auVar16 = vpmaddubsw_avx2(auVar16,auVar26);
          auVar28 = vphaddw_avx(auVar16._0_16_,auVar16._16_16_);
          auVar28 = vpaddw_avx(auVar28,auVar19);
          auVar28 = vpsrlw_avx(auVar28,7);
          auVar28 = vpackuswb_avx(auVar28,auVar28);
          *(long *)(dst + lVar11 + (int)uVar3) = auVar28._0_8_;
          lVar1 = (int)uVar3 + lVar11;
          lVar11 = lVar11 + 8;
        } while (lVar1 < (long)width + -0xf);
        uVar9 = uVar3 + (int)lVar11;
        lVar11 = lVar11 + lVar7 + -1;
      }
      else {
        lVar11 = (long)iVar8 + ~(uVar15 >> 3 & 0x1fffffff);
      }
      ppVar5 = src + lVar11;
      if ((int)(uVar9 + 3) < width) {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = *(ulong *)(ppVar5 + -1);
        auVar28 = vpshufb_avx(auVar29,auVar2);
        auVar28 = vpmaddubsw_avx(auVar28,auVar25);
        auVar28 = vphaddw_avx(auVar28,auVar28);
        auVar28 = vpaddw_avx(auVar28,auVar19);
        auVar28 = vpsrlw_avx(auVar28,7);
        auVar28 = vpackuswb_avx(auVar28,auVar28);
        *(int *)(dst + (int)uVar9) = auVar28._0_4_;
        uVar9 = uVar9 + 4;
        ppVar5 = ppVar5 + 4;
      }
      if ((int)uVar9 < width) {
        lVar11 = 0;
        do {
          dst[lVar11 + (int)uVar9] =
               (pel)((uint)ppVar5[lVar11] * (uVar12 + 0x20) +
                     (uint)ppVar5[lVar11 + 1] * (0x40 - uVar12) +
                     (uint)ppVar5[lVar11 + 2] * (0x20 - uVar12) + ppVar5[lVar11 + -1] * uVar12 +
                     0x40 >> 7);
          lVar11 = lVar11 + 1;
        } while ((long)width - (long)(int)uVar9 != lVar11);
      }
      dst = dst + i_dst;
      ppVar10 = ppVar10 + -1;
    } while (uVar15 != (uint)height);
  }
  return;
}

Assistant:

void uavs3d_ipred_ang_xy_13_avx2(pel *src, pel *dst, int i_dst, int mode, int width, int height)
{
    int i, j;
    pel *psrc = src;
    int step1_height = COM_MIN(height, 7);

    __m256i shuffle_x = _mm256_setr_epi8(0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6, 0, 1, 2, 3, 1, 2, 3, 4, 2, 3, 4, 5, 3, 4, 5, 6);
    __m128i c_64 = _mm_set1_epi16(64);

    for (j = 0; j < step1_height; j++) {
        int d = j + 1;
        pel *px = src - (d >> 3);
        int offsetx = (d << 2) & 0x1f;
        int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
        __m256i coeff_x = _mm256_set1_epi32(offsetx + (c << 8) + (b << 16) + (a << 24));

        for (i = 0; i + 4 < width; i += 8, px += 8) {
            IPRED_ANG_XY_X8(px, shuffle_x, coeff_x, c_64, 7, dst + i)
        }
        if (i < width) {
            IPRED_ANG_XY_X4(px, _mm256_castsi256_si128(shuffle_x), _mm256_castsi256_si128(coeff_x), c_64, 7, dst + i)
        }
        dst += i_dst;
    }

    if (width == 4) {
        for (; j < height; j++) {
            int d = j + 1;
            int step1_width = (int)(((j + 1) / 8.0 + 0.9999)) - 1;
            int offsetx = (d << 2) & 0x1f;
            int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
            pel *px = src + step1_width - (d >> 3);
            pel *py = psrc - j + 8;

            step1_width = COM_MIN(step1_width, width);

            for (i = 0; i < step1_width; i++, py += 8) {
                dst[i] = (py[-2] + (py[-1] << 1) + py[0] + 2) >> 2;
            }
            for (; i < width; i++, px++) {
                dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
            }
            dst += i_dst;
        }
    }
    else {
        for (; j < height; j++) {
            int d = j + 1;
            int step1_width = (int)(((j + 1) / 8.0 + 0.9999)) - 1;
            int offsetx = (d << 2) & 0x1f;
            int a = 32 - offsetx, b = 64 - offsetx, c = 32 + offsetx;
            pel *px = src + step1_width - (d >> 3);
            pel *py = psrc - j + 8;
            __m256i coeff_x = _mm256_set1_epi32(offsetx + (c << 8) + (b << 16) + (a << 24));

            step1_width = COM_MIN(step1_width, width);

            for (i = 0; i < step1_width; i++, py += 8) {
                dst[i] = (py[-2] + (py[-1] << 1) + py[0] + 2) >> 2;
            }

            for (i = step1_width; i + 7 < width; i += 8, px += 8) {
                IPRED_ANG_XY_X8(px, shuffle_x, coeff_x, c_64, 7, dst + i)
            }
            if (i + 3 < width) {
                IPRED_ANG_XY_X4(px, _mm256_castsi256_si128(shuffle_x), _mm256_castsi256_si128(coeff_x), c_64, 7, dst + i)
                    i += 4;
                px += 4;
            }
            for (; i < width; i++, px++) {
                dst[i] = (px[2] * a + px[1] * b + px[0] * c + px[-1] * offsetx + 64) >> 7;
            }
            dst += i_dst;
        }
    }
}